

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseRunner.hpp
# Opt level: O2

void __thiscall Centaurus::BaseRunner::acquire_memory(BaseRunner *this,bool is_allocating)

{
  int __fd;
  size_t __length;
  void *pvVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,is_allocating);
  __fd = shm_open(this->m_memory_name,iVar2 << 6 | 2,0x180);
  __length = get_window_size(this);
  ftruncate(__fd,__length);
  pvVar1 = mmap((void *)0x0,(long)this->m_bank_num * 8 + 0x7fffffU & 0xffffffffff800000,3,1,__fd,0);
  this->m_sub_window = pvVar1;
  pvVar1 = mmap((void *)0x0,
                (this->m_bank_size + 0x7fffff & 0xffffffffff800000) * (long)this->m_bank_num,3,1,
                __fd,(long)this->m_bank_num * 8 + 0x7fffffU & 0xffffffffff800000);
  this->m_main_window = pvVar1;
  if (iVar2 != 0) {
    close(__fd);
    return;
  }
  return;
}

Assistant:

void acquire_memory(bool is_allocating)
  {
#if defined(CENTAURUS_BUILD_WINDOWS)
    m_mem_handle  = (is_allocating) ? CreateFileMappingA(INVALID_HANDLE_VALUE, NULL, PAGE_READWRITE, 0, get_window_size(), m_memory_name)
                                    : OpenFileMappingA(FILE_MAP_ALL_ACCESS, FALSE, m_memory_name);
    m_sub_window  = MapViewOfFile(m_mem_handle, FILE_MAP_ALL_ACCESS, 0, 0, get_sub_window_size());
    m_main_window = MapViewOfFile(m_mem_handle, FILE_MAP_ALL_ACCESS, 0, get_sub_window_size(), get_main_window_size());
#elif defined(CENTAURUS_BUILD_LINUX)
    int fd = shm_open(m_memory_name, (is_allocating) ? O_RDWR | O_CREAT : O_RDWR, 0600);
    ftruncate(fd, get_window_size());
    m_sub_window  = mmap(NULL, get_sub_window_size(), PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    m_main_window = mmap(NULL, get_main_window_size(), PROT_READ | PROT_WRITE, MAP_SHARED, fd, get_sub_window_size());
    if (is_allocating) close(fd);
#endif
  }